

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait-swap.c
# Opt level: O0

_Bool borg_has_bad_curse(borg_item_conflict *item)

{
  borg_item_conflict *item_local;
  
  if ((((((item->curses[2] & 1U) == 0) && ((item->curses[0xb] & 1U) == 0)) &&
       ((item->curses[0xc] & 1U) == 0)) &&
      (((((item->curses[0xd] & 1U) == 0 && ((item->curses[0xe] & 1U) == 0)) &&
        (((item->curses[0x10] & 1U) == 0 &&
         (((item->curses[0xf] & 1U) == 0 && ((item->curses[0x11] & 1U) == 0)))))) &&
       ((item->curses[0x15] & 1U) == 0)))) &&
     ((((item->curses[0x16] & 1U) == 0 && ((item->curses[0x17] & 1U) == 0)) &&
      ((item->curses[0] & 1U) == 0)))) {
    item_local._7_1_ = false;
  }
  else {
    item_local._7_1_ = true;
  }
  return item_local._7_1_;
}

Assistant:

static bool borg_has_bad_curse(borg_item *item)
{
    if (item->curses[BORG_CURSE_TELEPORTATION]
        || item->curses[BORG_CURSE_POISON] || item->curses[BORG_CURSE_SIREN]
        || item->curses[BORG_CURSE_HALLUCINATION]
        || item->curses[BORG_CURSE_PARALYSIS]
        || item->curses[BORG_CURSE_DEMON_SUMMON]
        || item->curses[BORG_CURSE_DRAGON_SUMMON]
        || item->curses[BORG_CURSE_UNDEAD_SUMMON]
        || item->curses[BORG_CURSE_STONE]
        || item->curses[BORG_CURSE_ANTI_TELEPORTATION]
        || item->curses[BORG_CURSE_TREACHEROUS_WEAPON]
        || item->curses[BORG_CURSE_UNKNOWN])
        return true;
    return false;
}